

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

bool CoreML::Specification::TreeEnsemblePostEvaluationTransform_IsValid(int value)

{
  return (uint)value < 4;
}

Assistant:

bool TreeEnsemblePostEvaluationTransform_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
    case 3:
      return true;
    default:
      return false;
  }
}